

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

void __thiscall chrono::ChFile_ps_graph_setting::InitializeDefaults(ChFile_ps_graph_setting *this)

{
  (this->Xaxis).axis = true;
  (this->Xaxis).axis_color.r = 0.5;
  (this->Xaxis).axis_color.g = 0.5;
  (this->Xaxis).axis_color.b = 0.5;
  (this->Xaxis).axis_width = 0.02;
  (this->Xaxis).ticks = true;
  (this->Xaxis).ticks_step = 0.1;
  (this->Xaxis).ticks_width = 0.04;
  (this->Xaxis).label[0] = ' ';
  (this->Xaxis).label[1] = '\0';
  (this->Xaxis).label_color.r = 0.0;
  (this->Xaxis).label_color.g = 0.0;
  (this->Xaxis).label_color.b = 0.0;
  (this->Xaxis).label_fontsize = 0.32;
  (this->Xaxis).label_fontname = 0;
  (this->Xaxis).numbers = true;
  (this->Xaxis).numbers_color.r = 0.0;
  (this->Xaxis).numbers_color.g = 0.0;
  (this->Xaxis).numbers_color.b = 0.0;
  (this->Xaxis).numbers_fontsize = 0.2;
  (this->Xaxis).min = 0.0;
  (this->Xaxis).max = 1.0;
  (this->Yaxis).axis = true;
  (this->Yaxis).axis_color.r = 0.5;
  (this->Yaxis).axis_color.g = 0.5;
  (this->Yaxis).axis_color.b = 0.5;
  (this->Yaxis).axis_width = 0.02;
  (this->Yaxis).ticks = true;
  (this->Yaxis).ticks_step = 0.1;
  (this->Yaxis).ticks_width = 0.04;
  (this->Yaxis).label[0] = ' ';
  (this->Yaxis).label[1] = '\0';
  (this->Yaxis).label_color.b = 0.0;
  (this->Yaxis).label_color.r = 0.0;
  (this->Yaxis).label_color.g = 0.0;
  (this->Yaxis).label_fontsize = 0.32;
  (this->Yaxis).label_fontname = 0;
  (this->Yaxis).numbers = true;
  (this->Yaxis).numbers_color.r = 0.0;
  (this->Yaxis).numbers_color.g = 0.0;
  (this->Yaxis).numbers_color.b = 0.0;
  (this->Yaxis).numbers_fontsize = 0.2;
  (this->Yaxis).min = 0.0;
  (this->Yaxis).max = 1.0;
  (this->Xaxis).label[0] = 't';
  (this->Xaxis).label[1] = '\0';
  (this->Yaxis).label[0] = 'Y';
  (this->Yaxis).label[1] = '\0';
  this->gridx = true;
  this->gridy = true;
  this->grid_width = 0.02;
  (this->grid_color).r = 0.5;
  (this->grid_color).g = 0.6;
  (this->grid_color).b = 0.9;
  builtin_strncpy(this->title,"title",6);
  (this->title_color).r = 0.0;
  (this->title_color).g = 0.0;
  (this->title_color).b = 0.0;
  this->title_fontsize = 0.4;
  this->title_fontname = 0;
  this->picture_sizeX = 16.0;
  this->picture_sizeY = 6.0;
  (this->def_line_color).r = 0.7;
  (this->def_line_color).g = 0.0;
  (this->def_line_color).b = 0.0;
  this->def_line_width = 0.035;
  return;
}

Assistant:

void ChFile_ps_graph_setting::InitializeDefaults() {
    Xaxis.InitializeDefaults();
    Yaxis.InitializeDefaults();

    Xaxis.SetLabel((char*)"t");
    Yaxis.SetLabel((char*)"Y");

    gridx = true;
    gridy = true;
    grid_color.Set(0.5, 0.6, 0.9);
    grid_width = 0.02;

    SetTitle((char*)"title");
    title_color.SetGray(.0);
    title_fontsize = 0.4;
    title_fontname = 0;

    picture_sizeX = 16.0;
    picture_sizeY = 6.0;

    def_line_color.Set(0.7, 0, 0);
    def_line_width = 0.035;
}